

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O2

IHEVCD_ERROR_T
ihevcd_short_term_ref_pic_set
          (bitstrm_t *ps_bitstrm,stref_picset_t *ps_stref_picset_base,
          WORD32 num_short_term_ref_pic_sets,WORD32 idx,stref_picset_t *ps_stref_picset)

{
  short sVar1;
  WORD16 WVar2;
  WORD8 WVar3;
  char cVar4;
  UWORD32 UVar5;
  uint uVar6;
  UWORD32 UVar7;
  UWORD32 UVar8;
  ulong uVar9;
  int iVar10;
  char cVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  uint local_3c;
  uint local_38;
  
  if (idx < 1) {
    ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = '\0';
  }
  else {
    UVar5 = ihevcd_bits_get(ps_bitstrm,1);
    ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = (char)UVar5;
    if ((char)UVar5 != '\0') {
      if (idx == num_short_term_ref_pic_sets) {
        UVar5 = ihevcd_uev(ps_bitstrm);
        uVar6 = ~UVar5;
      }
      else {
        uVar6 = 0xffffffff;
      }
      uVar6 = uVar6 + idx;
      lVar17 = 0;
      uVar12 = 0;
      if (0 < (int)uVar6) {
        uVar12 = uVar6;
      }
      if (idx <= (int)uVar6) {
        uVar12 = idx - 1;
      }
      UVar5 = ihevcd_bits_get(ps_bitstrm,1);
      UVar7 = ihevcd_uev(ps_bitstrm);
      local_38 = 0;
      local_3c = 0;
      iVar16 = 0;
      for (; lVar17 <= ps_stref_picset_base[uVar12].i1_num_delta_pocs; lVar17 = lVar17 + 1) {
        UVar8 = ihevcd_bits_get(ps_bitstrm,1);
        ps_stref_picset->ai1_used[iVar16] = (WORD8)UVar8;
        if (UVar8 == 0) {
          UVar8 = ihevcd_bits_get(ps_bitstrm,1);
          UVar8 = UVar8 * 2;
        }
        if (UVar8 - 1 < 2) {
          iVar10 = 0;
          if (lVar17 < ps_stref_picset_base[uVar12].i1_num_delta_pocs) {
            iVar10 = (int)ps_stref_picset_base[uVar12].ai2_delta_poc[lVar17];
          }
          uVar6 = iVar10 + (UVar5 * -2 + 1) * (UVar7 + 1);
          ps_stref_picset->ai2_delta_poc[iVar16] = (WORD16)uVar6;
          local_38 = local_38 - ((int)uVar6 >> 0x1f);
          local_3c = local_3c - ((int)~uVar6 >> 0x1f);
          iVar16 = iVar16 + 1;
        }
        ps_stref_picset->ai1_ref_idc[lVar17] = (WORD8)UVar8;
      }
      lVar17 = 0;
      if ((int)local_38 < 1) {
        local_38 = 0;
      }
      uVar9 = 0xf;
      if ((int)local_38 < 0xf) {
        uVar9 = (ulong)local_38;
      }
      uVar13 = (uint)uVar9 ^ 0xf;
      uVar6 = 0;
      if (0 < (int)local_3c) {
        uVar6 = local_3c;
      }
      if ((int)uVar13 < (int)local_3c) {
        uVar6 = uVar13;
      }
      uVar13 = uVar6 + (uint)uVar9;
      ps_stref_picset->i1_num_ref_idc = ps_stref_picset_base[uVar12].i1_num_delta_pocs + '\x01';
      ps_stref_picset->i1_num_delta_pocs = (WORD8)uVar13;
      ps_stref_picset->i1_num_pos_pics = (WORD8)uVar6;
      ps_stref_picset->i1_num_neg_pics = (WORD8)uVar9;
      for (uVar14 = 1; uVar14 < uVar13; uVar14 = uVar14 + 1) {
        sVar1 = ps_stref_picset->ai2_delta_poc[uVar14];
        WVar3 = ps_stref_picset->ai1_used[uVar14];
        for (lVar15 = lVar17; lVar15 != -1 && -1 < lVar15 + 1; lVar15 = lVar15 + -1) {
          if (sVar1 < ps_stref_picset->ai2_delta_poc[lVar15]) {
            ps_stref_picset->ai2_delta_poc[lVar15 + 1] = ps_stref_picset->ai2_delta_poc[lVar15];
            ps_stref_picset->ai1_used[lVar15 + 1] = ps_stref_picset->ai1_used[lVar15];
            ps_stref_picset->ai2_delta_poc[lVar15] = sVar1;
            ps_stref_picset->ai1_used[lVar15] = WVar3;
          }
        }
        lVar17 = lVar17 + 1;
      }
      uVar14 = 0xf;
      if (local_38 < 0xf) {
        uVar14 = (ulong)local_38;
      }
      for (lVar17 = 0x23; lVar17 - (uVar9 >> 1) != 0x23; lVar17 = lVar17 + 1) {
        WVar2 = ps_stref_picset[-1].ai2_delta_poc[lVar17];
        WVar3 = *(WORD8 *)((long)ps_stref_picset->ai2_delta_poc + lVar17);
        ps_stref_picset[-1].ai2_delta_poc[lVar17] = ps_stref_picset->ai2_delta_poc[uVar14 - 1];
        *(WORD8 *)((long)ps_stref_picset->ai2_delta_poc + lVar17) =
             ps_stref_picset->ai1_used[uVar14 - 1];
        ps_stref_picset->ai2_delta_poc[uVar14 - 1] = WVar2;
        ps_stref_picset->ai1_used[uVar14 - 1] = WVar3;
        uVar14 = uVar14 - 1;
      }
      return 0;
    }
  }
  UVar5 = ihevcd_uev(ps_bitstrm);
  uVar14 = 0;
  uVar9 = (ulong)UVar5;
  if ((char)UVar5 < '\0') {
    uVar9 = uVar14;
  }
  WVar3 = (WORD8)uVar9;
  if ('\x0f' < (char)UVar5) {
    WVar3 = '\x0f';
  }
  ps_stref_picset->i1_num_neg_pics = WVar3;
  UVar5 = ihevcd_uev(ps_bitstrm);
  cVar4 = (char)UVar5;
  uVar6 = (uint)ps_stref_picset->i1_num_neg_pics;
  cVar11 = '\0';
  if ('\0' < cVar4) {
    cVar11 = cVar4;
  }
  if ((int)(0xf - uVar6) < (int)cVar4) {
    cVar11 = (char)(0xf - uVar6);
  }
  ps_stref_picset->i1_num_pos_pics = cVar11;
  ps_stref_picset->i1_num_delta_pocs = cVar11 + ps_stref_picset->i1_num_neg_pics;
  iVar16 = 0;
  for (; lVar17 = (long)(char)uVar6, (long)uVar14 < lVar17; uVar14 = uVar14 + 1) {
    UVar5 = ihevcd_uev(ps_bitstrm);
    iVar16 = iVar16 + ~UVar5;
    ps_stref_picset->ai2_delta_poc[uVar14] = (WORD16)iVar16;
    UVar5 = ihevcd_bits_get(ps_bitstrm,1);
    ps_stref_picset->ai1_used[uVar14] = (WORD8)UVar5;
    uVar6 = (uint)(byte)ps_stref_picset->i1_num_neg_pics;
  }
  iVar16 = 0;
  for (; lVar17 < ps_stref_picset->i1_num_delta_pocs; lVar17 = lVar17 + 1) {
    UVar5 = ihevcd_uev(ps_bitstrm);
    iVar16 = iVar16 + UVar5 + 1;
    ps_stref_picset->ai2_delta_poc[lVar17] = (WORD16)iVar16;
    UVar5 = ihevcd_bits_get(ps_bitstrm,1);
    ps_stref_picset->ai1_used[lVar17] = (WORD8)UVar5;
  }
  return 0;
}

Assistant:

IHEVCD_ERROR_T ihevcd_short_term_ref_pic_set(bitstrm_t *ps_bitstrm,
                                             stref_picset_t *ps_stref_picset_base,
                                             WORD32 num_short_term_ref_pic_sets,
                                             WORD32 idx,
                                             stref_picset_t *ps_stref_picset)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 value;
    stref_picset_t *ps_stref_picset_ref;
    WORD32 delta_idx, delta_rps;
    WORD32 r_idx;
    WORD32 i;
    WORD32 j, k, temp;
    if(idx > 0)
    {
        BITS_PARSE("inter_ref_pic_set_prediction_flag", value, ps_bitstrm, 1);
        ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = value;
    }
    else
        ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = 0;

    if(ps_stref_picset->i1_inter_ref_pic_set_prediction_flag)
    {
        WORD32 delta_rps_sign;
        WORD32 abs_delta_rps;
        WORD32 num_neg_pics = 0;
        WORD32 num_pos_pics = 0;
        WORD32 num_pics = 0;

        if(idx == num_short_term_ref_pic_sets)
        {
            UEV_PARSE("delta_idx_minus1", value, ps_bitstrm);
            delta_idx = value + 1;
        }
        else
        {
            delta_idx = 1;
        }
        r_idx = idx - delta_idx;
        r_idx = CLIP3(r_idx, 0, idx - 1);

        ps_stref_picset_ref = ps_stref_picset_base + r_idx;

        BITS_PARSE("delta_rps_sign", value, ps_bitstrm, 1);
        delta_rps_sign = value;

        UEV_PARSE("abs_delta_rps_minus1", value, ps_bitstrm);
        abs_delta_rps = value + 1;

        delta_rps = (1 - 2 * delta_rps_sign) * (abs_delta_rps);



        for(i = 0; i <= ps_stref_picset_ref->i1_num_delta_pocs; i++)
        {
            WORD32 ref_idc;

            /*****************************************************************/
            /* ref_idc is parsed as below                                    */
            /* bits "1" ref_idc 1                                            */
            /* bits "01" ref_idc 2                                           */
            /* bits "00" ref_idc 0                                           */
            /*****************************************************************/
            BITS_PARSE("used_by_curr_pic_flag", value, ps_bitstrm, 1);
            ref_idc = value;
            ps_stref_picset->ai1_used[num_pics] = value;
            /* If ref_idc is zero check for next bit */
            if(0 == ref_idc)
            {
                BITS_PARSE("use_delta_flag", value, ps_bitstrm, 1);
                ref_idc = value << 1;
            }
            if((ref_idc == 1) || (ref_idc == 2))
            {
                WORD32 delta_poc;
                delta_poc = delta_rps;
                delta_poc +=
                                ((i < ps_stref_picset_ref->i1_num_delta_pocs) ?
                                ps_stref_picset_ref->ai2_delta_poc[i] :
                                0);

                ps_stref_picset->ai2_delta_poc[num_pics] = delta_poc;

                if(delta_poc < 0)
                {
                    num_neg_pics++;
                }
                else
                {
                    num_pos_pics++;
                }
                num_pics++;
            }
            ps_stref_picset->ai1_ref_idc[i] = ref_idc;
        }

        num_neg_pics = CLIP3(num_neg_pics, 0, MAX_DPB_SIZE - 1);
        num_pos_pics = CLIP3(num_pos_pics, 0, (MAX_DPB_SIZE - 1 - num_neg_pics));
        num_pics = num_neg_pics + num_pos_pics;

        ps_stref_picset->i1_num_ref_idc =
                        ps_stref_picset_ref->i1_num_delta_pocs + 1;
        ps_stref_picset->i1_num_delta_pocs = num_pics;
        ps_stref_picset->i1_num_pos_pics = num_pos_pics;
        ps_stref_picset->i1_num_neg_pics = num_neg_pics;


        for(j = 1; j < num_pics; j++)
        {
            WORD32 delta_poc = ps_stref_picset->ai2_delta_poc[j];
            WORD8 i1_used = ps_stref_picset->ai1_used[j];
            for(k = j - 1; k >= 0; k--)
            {
                temp = ps_stref_picset->ai2_delta_poc[k];
                if(delta_poc < temp)
                {
                    ps_stref_picset->ai2_delta_poc[k + 1] = temp;
                    ps_stref_picset->ai1_used[k + 1] = ps_stref_picset->ai1_used[k];
                    ps_stref_picset->ai2_delta_poc[k] = delta_poc;
                    ps_stref_picset->ai1_used[k] = i1_used;
                }
            }
        }
        // flip the negative values to largest first
        for(j = 0, k = num_neg_pics - 1; j < num_neg_pics >> 1; j++, k--)
        {
            WORD32 delta_poc = ps_stref_picset->ai2_delta_poc[j];
            WORD8 i1_used = ps_stref_picset->ai1_used[j];
            ps_stref_picset->ai2_delta_poc[j] = ps_stref_picset->ai2_delta_poc[k];
            ps_stref_picset->ai1_used[j] = ps_stref_picset->ai1_used[k];
            ps_stref_picset->ai2_delta_poc[k] = delta_poc;
            ps_stref_picset->ai1_used[k] = i1_used;
        }

    }
    else
    {
        WORD32 prev_poc = 0;
        WORD32 poc;

        UEV_PARSE("num_negative_pics", value, ps_bitstrm);
        ps_stref_picset->i1_num_neg_pics = value;
        ps_stref_picset->i1_num_neg_pics = CLIP3(ps_stref_picset->i1_num_neg_pics,
                                                 0,
                                                 MAX_DPB_SIZE - 1);

        UEV_PARSE("num_positive_pics", value, ps_bitstrm);
        ps_stref_picset->i1_num_pos_pics = value;
        ps_stref_picset->i1_num_pos_pics = CLIP3(ps_stref_picset->i1_num_pos_pics,
                                                 0,
                                                 (MAX_DPB_SIZE - 1 - ps_stref_picset->i1_num_neg_pics));

        ps_stref_picset->i1_num_delta_pocs =
                        ps_stref_picset->i1_num_neg_pics +
                        ps_stref_picset->i1_num_pos_pics;


        for(i = 0; i < ps_stref_picset->i1_num_neg_pics; i++)
        {
            UEV_PARSE("delta_poc_s0_minus1", value, ps_bitstrm);
            poc = prev_poc - (value + 1);
            prev_poc = poc;
            ps_stref_picset->ai2_delta_poc[i] = poc;

            BITS_PARSE("used_by_curr_pic_s0_flag", value, ps_bitstrm, 1);
            ps_stref_picset->ai1_used[i] = value;

        }
        prev_poc = 0;
        for(i = ps_stref_picset->i1_num_neg_pics;
                        i < ps_stref_picset->i1_num_delta_pocs;
                        i++)
        {
            UEV_PARSE("delta_poc_s1_minus1", value, ps_bitstrm);
            poc = prev_poc + (value + 1);
            prev_poc = poc;
            ps_stref_picset->ai2_delta_poc[i] = poc;

            BITS_PARSE("used_by_curr_pic_s1_flag", value, ps_bitstrm, 1);
            ps_stref_picset->ai1_used[i] = value;

        }

    }

    return ret;
}